

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_135ab76::CheckPathParametersEx
          (anon_unknown_dwarf_135ab76 *this,cmGeneratorExpressionContext *ctx,
          GeneratorExpressionContent *cnt,string_view option,size_t count,int required,bool exactly)

{
  string_view view;
  char local_121;
  char *local_120;
  char local_111;
  char *local_110;
  cmGeneratorExpressionContext *local_108;
  size_t sStack_100;
  cmAlphaNum local_f0;
  cmAlphaNum local_b0;
  string local_80;
  string local_60;
  byte local_3d;
  int local_3c;
  bool exactly_local;
  char *pcStack_38;
  int required_local;
  size_t count_local;
  GeneratorExpressionContent *cnt_local;
  cmGeneratorExpressionContext *ctx_local;
  string_view option_local;
  
  pcStack_38 = option._M_str;
  option_local._M_len = option._M_len;
  local_3c = (int)count;
  local_3d = (byte)required & 1;
  if (((int)option._M_str < local_3c) || (((required & 1U) != 0 && (local_3c < (int)option._M_str)))
     ) {
    count_local = (size_t)ctx;
    cnt_local = (GeneratorExpressionContent *)this;
    ctx_local = (cmGeneratorExpressionContext *)cnt;
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_60,(GeneratorExpressionContent *)ctx);
    cmAlphaNum::cmAlphaNum(&local_b0,"$<PATH:");
    local_108 = ctx_local;
    sStack_100 = option_local._M_len;
    view._M_str = (char *)option_local._M_len;
    view._M_len = (size_t)ctx_local;
    cmAlphaNum::cmAlphaNum(&local_f0,view);
    local_110 = "at least";
    if ((local_3d & 1) != 0) {
      local_110 = "exactly";
    }
    local_111 = ' ';
    local_120 = "two parameters";
    if (local_3c == 1) {
      local_120 = "one parameter";
    }
    local_121 = '.';
    cmStrCat<char[23],char_const*,char,char_const*,char>
              (&local_80,&local_b0,&local_f0,(char (*) [23])"> expression requires ",&local_110,
               &local_111,&local_120,&local_121);
    reportError((cmGeneratorExpressionContext *)this,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    option_local._M_str._7_1_ = false;
  }
  else {
    option_local._M_str._7_1_ = true;
  }
  return option_local._M_str._7_1_;
}

Assistant:

bool CheckPathParametersEx(cmGeneratorExpressionContext* ctx,
                           const GeneratorExpressionContent* cnt,
                           cm::string_view option, std::size_t count,
                           int required = 1, bool exactly = true)
{
  if (static_cast<int>(count) < required ||
      (exactly && static_cast<int>(count) > required)) {
    reportError(ctx, cnt->GetOriginalExpression(),
                cmStrCat("$<PATH:", option, "> expression requires ",
                         (exactly ? "exactly" : "at least"), ' ',
                         (required == 1 ? "one parameter" : "two parameters"),
                         '.'));
    return false;
  }
  return true;
}